

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

void __thiscall
luna::Function::AddLocalVar(Function *this,String *name,int register_id,int begin_pc,int end_pc)

{
  LocalVarInfo local_18;
  
  local_18.name_ = name;
  local_18.register_id_ = register_id;
  local_18.begin_pc_ = begin_pc;
  local_18.end_pc_ = end_pc;
  std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>::
  emplace_back<luna::Function::LocalVarInfo>(&this->local_vars_,&local_18);
  return;
}

Assistant:

void Function::AddLocalVar(String *name, int register_id,
                               int begin_pc, int end_pc)
    {
        local_vars_.push_back(LocalVarInfo(name, register_id, begin_pc, end_pc));
    }